

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O3

void __thiscall
google::protobuf::util::converter::JsonObjectWriter::WriteChar(JsonObjectWriter *this,char c)

{
  CodedOutputStream *this_00;
  uint8 *puVar1;
  uint8 *puVar2;
  undefined1 local_11 [8];
  char c_local;
  
  this_00 = this->stream_;
  puVar1 = (this_00->impl_).end_;
  puVar2 = this_00->cur_;
  if (puVar1 == puVar2 || (long)puVar1 - (long)puVar2 < 0) {
    puVar2 = io::EpsCopyOutputStream::WriteRawFallback(&this_00->impl_,local_11,1,puVar2);
  }
  else {
    *puVar2 = c;
    puVar2 = puVar2 + 1;
  }
  this_00->cur_ = puVar2;
  return;
}

Assistant:

void WriteChar(const char c) { stream_->WriteRaw(&c, sizeof(c)); }